

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void __thiscall
bench::save(bench *this,ostream *os,string *name,
           vector<bench::element,_std::allocator<bench::element>_> *c)

{
  string *psVar1;
  reference this_00;
  size_type sVar2;
  double *args;
  const_reference args_00;
  size_t end_j;
  size_t j;
  size_type local_68;
  size_t e;
  size_t i;
  string local_48;
  vector<bench::element,_std::allocator<bench::element>_> *local_28;
  vector<bench::element,_std::allocator<bench::element>_> *c_local;
  string *name_local;
  ostream *os_local;
  bench *this_local;
  
  local_28 = c;
  c_local = (vector<bench::element,_std::allocator<bench::element>_> *)name;
  name_local = (string *)os;
  os_local = (ostream *)this;
  std::__cxx11::string::string((string *)&local_48,name);
  save_header(this,os,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  e = 0;
  local_68 = std::vector<bench::model,_std::allocator<bench::model>_>::size(&this->models);
  for (; psVar1 = name_local, e != local_68; e = e + 1) {
    this_00 = std::vector<bench::model,_std::allocator<bench::model>_>::operator[](&this->models,e);
    _j = model::name(this_00);
    ::fmt::v7::print<char[4],std::basic_string_view<char,std::char_traits<char>>,char>
              ((basic_ostream<char,_std::char_traits<char>_> *)psVar1,(char (*) [4])"{},",
               (basic_string_view<char,_std::char_traits<char>_> *)&j);
    end_j = 0;
    sVar2 = std::vector<bench::solver,_std::allocator<bench::solver>_>::size(&this->solvers);
    for (; psVar1 = name_local, end_j != sVar2; end_j = end_j + 1) {
      args = baryonyx::dynamic_array<double>::operator()(&this->array,e,end_j);
      ::fmt::v7::print<char[9],double&,char>
                ((basic_ostream<char,_std::char_traits<char>_> *)psVar1,(char (*) [9])"{:.10g},",
                 args);
    }
    args_00 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[](local_28,e);
    ::fmt::v7::print<char[9],double_const&,char>
              ((basic_ostream<char,_std::char_traits<char>_> *)psVar1,(char (*) [9])0xc9a213,
               &args_00->solution);
  }
  return;
}

Assistant:

void save(std::ostream& os,
              std::string name,
              const std::vector<element>& c)
    {
        save_header(os, name);

        for (std::size_t i{ 0 }, e{ models.size() }; i != e; ++i) {
            fmt::print(os, "{},", models[i].name());

            for (std::size_t j{ 0 }, end_j{ solvers.size() }; j != end_j; ++j)
                fmt::print(os, "{:.10g},", array(i, j));

            fmt::print(os, "{:.10g}\n", c[i].solution);
        }
    }